

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O0

int PredictorSetupEncode(TIFF *tif)

{
  uint16_t uVar1;
  int *piVar2;
  int iVar3;
  TIFFDirectory *td;
  TIFFPredictorState *sp;
  TIFF *tif_local;
  
  piVar2 = (int *)tif->tif_data;
  iVar3 = (**(code **)(piVar2 + 0x1e))(tif);
  if ((iVar3 == 0) || (iVar3 = PredictorSetup(tif), iVar3 == 0)) {
    tif_local._4_4_ = 0;
  }
  else {
    if (*piVar2 == 2) {
      uVar1 = (tif->tif_dir).td_bitspersample;
      if (uVar1 == 8) {
        *(code **)(piVar2 + 0xc) = horDiff8;
      }
      else if (uVar1 == 0x10) {
        *(code **)(piVar2 + 0xc) = horDiff16;
      }
      else if (uVar1 == 0x20) {
        *(code **)(piVar2 + 0xc) = horDiff32;
      }
      else if (uVar1 == 0x40) {
        *(code **)(piVar2 + 0xc) = horDiff64;
      }
      if (tif->tif_encoderow != PredictorEncodeRow) {
        *(TIFFCodeMethod *)(piVar2 + 6) = tif->tif_encoderow;
        tif->tif_encoderow = PredictorEncodeRow;
        *(TIFFCodeMethod *)(piVar2 + 8) = tif->tif_encodestrip;
        tif->tif_encodestrip = PredictorEncodeTile;
        *(TIFFCodeMethod *)(piVar2 + 10) = tif->tif_encodetile;
        tif->tif_encodetile = PredictorEncodeTile;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        if (*(code **)(piVar2 + 0xc) == horDiff16) {
          *(code **)(piVar2 + 0xc) = swabHorDiff16;
          tif->tif_postdecode = _TIFFNoPostDecode;
        }
        else if (*(code **)(piVar2 + 0xc) == horDiff32) {
          *(code **)(piVar2 + 0xc) = swabHorDiff32;
          tif->tif_postdecode = _TIFFNoPostDecode;
        }
        else if (*(code **)(piVar2 + 0xc) == horDiff64) {
          *(code **)(piVar2 + 0xc) = swabHorDiff64;
          tif->tif_postdecode = _TIFFNoPostDecode;
        }
      }
    }
    else if ((*piVar2 == 3) &&
            (*(code **)(piVar2 + 0xc) = fpDiff, tif->tif_encoderow != PredictorEncodeRow)) {
      *(TIFFCodeMethod *)(piVar2 + 6) = tif->tif_encoderow;
      tif->tif_encoderow = PredictorEncodeRow;
      *(TIFFCodeMethod *)(piVar2 + 8) = tif->tif_encodestrip;
      tif->tif_encodestrip = PredictorEncodeTile;
      *(TIFFCodeMethod *)(piVar2 + 10) = tif->tif_encodetile;
      tif->tif_encodetile = PredictorEncodeTile;
    }
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

static int PredictorSetupEncode(TIFF *tif)
{
    TIFFPredictorState *sp = PredictorState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    if (!(*sp->setupencode)(tif) || !PredictorSetup(tif))
        return 0;

    if (sp->predictor == 2)
    {
        switch (td->td_bitspersample)
        {
            case 8:
                sp->encodepfunc = horDiff8;
                break;
            case 16:
                sp->encodepfunc = horDiff16;
                break;
            case 32:
                sp->encodepfunc = horDiff32;
                break;
            case 64:
                sp->encodepfunc = horDiff64;
                break;
        }
        /*
         * Override default encoding method with one that does the
         * predictor stuff.
         */
        if (tif->tif_encoderow != PredictorEncodeRow)
        {
            sp->encoderow = tif->tif_encoderow;
            tif->tif_encoderow = PredictorEncodeRow;
            sp->encodestrip = tif->tif_encodestrip;
            tif->tif_encodestrip = PredictorEncodeTile;
            sp->encodetile = tif->tif_encodetile;
            tif->tif_encodetile = PredictorEncodeTile;
        }

        /*
         * If the data is horizontally differenced 16-bit data that
         * requires byte-swapping, then it must be byte swapped after
         * the differentiation step.  We do this with a special-purpose
         * routine and override the normal post decoding logic that
         * the library setup when the directory was read.
         */
        if (tif->tif_flags & TIFF_SWAB)
        {
            if (sp->encodepfunc == horDiff16)
            {
                sp->encodepfunc = swabHorDiff16;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
            else if (sp->encodepfunc == horDiff32)
            {
                sp->encodepfunc = swabHorDiff32;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
            else if (sp->encodepfunc == horDiff64)
            {
                sp->encodepfunc = swabHorDiff64;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
        }
    }

    else if (sp->predictor == 3)
    {
        sp->encodepfunc = fpDiff;
        /*
         * Override default encoding method with one that does the
         * predictor stuff.
         */
        if (tif->tif_encoderow != PredictorEncodeRow)
        {
            sp->encoderow = tif->tif_encoderow;
            tif->tif_encoderow = PredictorEncodeRow;
            sp->encodestrip = tif->tif_encodestrip;
            tif->tif_encodestrip = PredictorEncodeTile;
            sp->encodetile = tif->tif_encodetile;
            tif->tif_encodetile = PredictorEncodeTile;
        }
    }

    return 1;
}